

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfsm-builder.cc
# Opt level: O3

void __thiscall
cnn::ClassFactoredSoftmaxBuilder::new_graph(ClassFactoredSoftmaxBuilder *this,ComputationGraph *cg)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pEVar3;
  ulong __new_size;
  ComputationGraph *local_38;
  uint local_30;
  
  this->pcg = cg;
  pbVar1 = (this->cdict).words_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->cdict).words_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  expr::parameter((ComputationGraph *)&local_38,(Parameters *)cg);
  (this->r2c).pg = local_38;
  (this->r2c).i.t = local_30;
  expr::parameter((ComputationGraph *)&local_38,(Parameters *)cg);
  (this->cbias).pg = local_38;
  (this->cbias).i.t = local_30;
  pEVar3 = (this->rc2ws).
           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->rc2ws).
      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar3) {
    (this->rc2ws).super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
    _M_impl.super__Vector_impl_data._M_finish = pEVar3;
  }
  pEVar3 = (this->rc2biases).
           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->rc2biases).
      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar3) {
    (this->rc2biases).
    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl.
    super__Vector_impl_data._M_finish = pEVar3;
  }
  __new_size = (ulong)((long)pbVar2 - (long)pbVar1) >> 5 & 0xffffffff;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
            (&this->rc2ws,__new_size);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
            (&this->rc2biases,__new_size);
  return;
}

Assistant:

void ClassFactoredSoftmaxBuilder::new_graph(ComputationGraph& cg) {
  pcg = &cg;
  const unsigned num_clusters = cdict.size();
  r2c = parameter(cg, p_r2c);
  cbias = parameter(cg, p_cbias);
  rc2ws.clear();
  rc2biases.clear();
  rc2ws.resize(num_clusters);
  rc2biases.resize(num_clusters);
}